

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall LLVMBC::ValueProxy::resolve(ValueProxy *this)

{
  pointer ppVVar1;
  Value *this_00;
  ValueKind VVar2;
  Value **ppVVar3;
  ValueProxy *pVVar4;
  LoggingCallback p_Var5;
  void *pvVar6;
  char *__ptr;
  undefined4 uVar7;
  size_t sStack_1020;
  char buffer [4096];
  
  if (this->proxy != (Value *)0x0) {
    return true;
  }
  ppVVar1 = (this->context->values).
            super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this->id <
      (ulong)((long)(this->context->values).
                    super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3)) {
    ppVVar3 = ppVVar1 + this->id;
    while( true ) {
      this_00 = *ppVVar3;
      this->proxy = this_00;
      if (this_00 == (Value *)0x0) break;
      VVar2 = Value::get_value_kind(this_00);
      if (VVar2 != Proxy) {
        if (this->proxy != (Value *)0x0) {
          return true;
        }
        break;
      }
      pVVar4 = cast<LLVMBC::ValueProxy>(this->proxy);
      resolve(pVVar4);
      pVVar4 = cast<LLVMBC::ValueProxy>(this->proxy);
      ppVVar3 = &pVVar4->proxy;
    }
    p_Var5 = dxil_spv::get_thread_log_callback();
    if (p_Var5 != (LoggingCallback)0x0) {
      builtin_strncpy(buffer + 0x10,"e proxy value.\n",0x10);
      buffer[0] = 'F';
      buffer[1] = 'a';
      buffer[2] = 'i';
      buffer[3] = 'l';
      buffer[4] = 'e';
      buffer[5] = 'd';
      buffer[6] = ' ';
      buffer[7] = 't';
      buffer[8] = 'o';
      buffer[9] = ' ';
      buffer[10] = 'r';
      buffer[0xb] = 'e';
      uVar7._0_1_ = 's';
      uVar7._1_1_ = 'o';
      uVar7._2_1_ = 'l';
      uVar7._3_1_ = 'v';
LAB_00171c63:
      buffer._12_2_ = (undefined2)uVar7;
      buffer._14_2_ = SUB42(uVar7,2);
      pvVar6 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var5)(pvVar6,Error,buffer);
      return false;
    }
    __ptr = "[ERROR]: Failed to resolve proxy value.\n";
    sStack_1020 = 0x28;
  }
  else {
    p_Var5 = dxil_spv::get_thread_log_callback();
    if (p_Var5 != (LoggingCallback)0x0) {
      builtin_strncpy(buffer + 0x10,"ut of range.\n",0xe);
      buffer[0] = 'V';
      buffer[1] = 'a';
      buffer[2] = 'l';
      buffer[3] = 'u';
      buffer[4] = 'e';
      buffer[5] = ' ';
      buffer[6] = 'p';
      buffer[7] = 'r';
      buffer[8] = 'o';
      buffer[9] = 'x';
      buffer[10] = 'y';
      buffer[0xb] = ' ';
      uVar7._0_1_ = 'i';
      uVar7._1_1_ = 's';
      uVar7._2_1_ = ' ';
      uVar7._3_1_ = 'o';
      goto LAB_00171c63;
    }
    __ptr = "[ERROR]: Value proxy is out of range.\n";
    sStack_1020 = 0x26;
  }
  fwrite(__ptr,sStack_1020,1,_stderr);
  fflush(_stderr);
  return false;
}

Assistant:

bool ValueProxy::resolve()
{
	if (proxy)
		return true;

	if (id >= context.values.size())
	{
		LOGE("Value proxy is out of range.\n");
		return false;
	}

	proxy = context.values[id];
	while (proxy && proxy->get_value_kind() == ValueKind::Proxy)
	{
		cast<ValueProxy>(proxy)->resolve();
		proxy = cast<ValueProxy>(proxy)->get_proxy_value();
	}

	if (!proxy)
	{
		LOGE("Failed to resolve proxy value.\n");
		return false;
	}
	return true;
}